

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aialgorithm.cpp
# Opt level: O0

void __thiscall
Test_aialgorithm_extractKeys_Test::~Test_aialgorithm_extractKeys_Test
          (Test_aialgorithm_extractKeys_Test *this)

{
  Test_aialgorithm_extractKeys_Test *this_local;
  
  ~Test_aialgorithm_extractKeys_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(Test_aialgorithm, extractKeys)
{
    // prepare
    std::map<size_t, size_t> map1;
    std::map<std::string, size_t> map2;
    std::map<size_t, std::string> map3;
    std::map<std::string, std::string> map4;
    static constexpr auto count = 5;

    std::stringstream etalon_str;
    for (size_t i=0;i<count;i++)
    {
        map1.insert(std::make_pair(i,  i * 100U));
        map2.insert(std::make_pair(std::to_string(i), i * 200U));
        map3.insert(std::make_pair(i, std::to_string(i * 300U)));
        map4.insert(std::make_pair(std::to_string(i), std::to_string(i * 400U)));
        etalon_str << i << " ";
    }

    const auto keys1 = ai::extractKeys(map1);
    const auto keys2 = ai::extractKeys(map2);
    const auto keys3 = ai::extractKeys(map3);
    const auto keys4 = ai::extractKeys(map4);
    std::stringstream actual_str[4];
    for (size_t i = 0; i<count; i++)
    {
        actual_str[0] << keys1[i] << " ";
        actual_str[1] << keys2[i] << " ";
        actual_str[2] << keys3[i] << " ";
        actual_str[3] << keys4[i] << " ";
    }

    ASSERT_EQ(actual_str[0].str(), etalon_str.str());
    ASSERT_EQ(actual_str[1].str(), etalon_str.str());
    ASSERT_EQ(actual_str[2].str(), etalon_str.str());
    ASSERT_EQ(actual_str[3].str(), etalon_str.str());
}